

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O0

void __thiscall hbm::streaming::StreamClient::StreamClient(StreamClient *this)

{
  function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
  *in_RDI;
  function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
  *this_00;
  
  this_00 = in_RDI;
  SocketNonblocking::SocketNonblocking((SocketNonblocking *)0x13e910);
  std::__cxx11::string::string((string *)(in_RDI + 0x2001));
  std::__cxx11::string::string((string *)(in_RDI + 0x2002));
  std::__cxx11::string::string((string *)(in_RDI + 0x2003));
  std::__cxx11::string::string((string *)(in_RDI + 0x2004));
  std::__cxx11::string::string((string *)(in_RDI + 0x2005));
  timeInfo::timeInfo((timeInfo *)(in_RDI + 0x2006));
  std::__cxx11::string::string((string *)&this_00[0x2006]._M_invoker);
  std::__cxx11::string::string((string *)&this_00[0x2007]._M_invoker);
  this_00[0x2008]._M_invoker = (_Invoker_type)0x0;
  std::
  function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
  ::function(this_00);
  return;
}

Assistant:

StreamClient::StreamClient()
			: m_streamSocket()
			, m_address()
			, m_httpPath()
			, m_streamId()
			, m_streamPort()
			, m_controlPort()
			, m_initialTime()
			, m_initialTimeScale()
			, m_initialTimeEpoch()
			, m_pSignalContainer(NULL)
			, m_streamMetaCb()
		{
		}